

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Own<kj::AsyncOutputStream,_std::nullptr_t> __thiscall
kj::anon_unknown_0::LowLevelAsyncIoProviderImpl::wrapOutputFd
          (LowLevelAsyncIoProviderImpl *this,int fd,uint flags)

{
  uint *in_RCX;
  UnixEventPort *pUVar1;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> OVar2;
  Own<kj::AsyncOutputStream,_std::nullptr_t> OVar3;
  _func_int **local_20;
  long local_18;
  
  OVar2 = heap<kj::(anonymous_namespace)::AsyncStreamFd,kj::UnixEventPort&,int&,unsigned_int&,kj::UnixEventPort::FdObserver::Flags>
                    ((kj *)&local_20,*(UnixEventPort **)(CONCAT44(in_register_00000034,fd) + 8),
                     (int *)CONCAT44(in_register_00000014,flags),in_RCX,(Flags *)0x2);
  OVar3.ptr = OVar2.ptr;
  (this->super_LowLevelAsyncIoProvider)._vptr_LowLevelAsyncIoProvider = local_20;
  pUVar1 = (UnixEventPort *)(local_18 + 8);
  if (local_18 == 0) {
    pUVar1 = (UnixEventPort *)0x0;
  }
  this->eventPort = pUVar1;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<AsyncOutputStream> wrapOutputFd(int fd, uint flags = 0) override {
    return heap<AsyncStreamFd>(eventPort, fd, flags, UnixEventPort::FdObserver::OBSERVE_WRITE);
  }